

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O0

MaterialList * rw::MaterialList::streamRead(Stream *stream,MaterialList *matlist)

{
  FILE *pFVar1;
  bool bVar2;
  char *pcVar3;
  Material **ppMVar4;
  EVP_PKEY_CTX *ctx;
  Error local_4c;
  Error _e_1;
  int32 i;
  Material *m;
  undefined4 local_30;
  Error _e;
  int32 numMat;
  int32 *indices;
  MaterialList *matlist_local;
  Stream *stream_local;
  
  stack0xffffffffffffffd8 = (void *)0x0;
  ctx = (EVP_PKEY_CTX *)0x1;
  bVar2 = findChunk(stream,1,(uint32 *)0x0,(uint32 *)0x0);
  if (bVar2) {
    init(matlist,ctx);
    _e.plugin = Stream::readI32(stream);
    if (_e.plugin == 0) {
      return matlist;
    }
    ppMVar4 = (Material **)
              malloc_LOC((long)(int)_e.plugin << 3,0x30007,
                         "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/geometry.cpp line: 777"
                        );
    matlist->materials = ppMVar4;
    if (matlist->materials != (Material **)0x0) {
      matlist->space = _e.plugin;
      register0x00000000 =
           malloc_LOC((long)(int)(_e.plugin << 2),0x10007,
                      "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/geometry.cpp line: 782"
                     );
      Stream::read32(stream,register0x00000000,_e.plugin << 2);
      _e_1.plugin = 0;
      do {
        if ((int)_e.plugin <= (int)_e_1.plugin) {
          (*DAT_00168638)(stack0xffffffffffffffd8);
          return matlist;
        }
        if (*(int *)((long)stack0xffffffffffffffd8 + (long)(int)_e_1.plugin * 4) < 0) {
          bVar2 = findChunk(stream,7,(uint32 *)0x0,(uint32 *)0x0);
          if (!bVar2) {
            local_4c.plugin = 7;
            local_4c.code = 0x80000004;
            fprintf(_stderr,"%s:%d: ",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/geometry.cpp"
                    ,0x318);
            pFVar1 = _stderr;
            pcVar3 = dbgsprint(0x80000004,"MATERIAL");
            fprintf(pFVar1,"%s\n",pcVar3);
            setError(&local_4c);
            break;
          }
          register0x00000000 = Material::streamRead(stream);
          if (register0x00000000 == (Material *)0x0) break;
        }
        else {
          unique0x00012000 =
               matlist->materials
               [*(int *)((long)stack0xffffffffffffffd8 + (long)(int)_e_1.plugin * 4)];
          Material::addRef(unique0x00012000);
        }
        appendMaterial(matlist,stack0xffffffffffffffc0);
        Material::destroy(stack0xffffffffffffffc0);
        _e_1.plugin = _e_1.plugin + 1;
      } while( true );
    }
  }
  else {
    m._4_4_ = 7;
    local_30 = 0x80000004;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/geometry.cpp"
            ,0x302);
    pFVar1 = _stderr;
    pcVar3 = dbgsprint(0x80000004,"STRUCT");
    fprintf(pFVar1,"%s\n",pcVar3);
    setError((Error *)((long)&m + 4));
  }
  (*DAT_00168638)(stack0xffffffffffffffd8);
  deinit(matlist);
  return (MaterialList *)0x0;
}

Assistant:

MaterialList*
MaterialList::streamRead(Stream *stream, MaterialList *matlist)
{
	int32 *indices = nil;
	int32 numMat;
	if(!findChunk(stream, ID_STRUCT, nil, nil)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		goto fail;
	}
	matlist->init();
	numMat = stream->readI32();
	if(numMat == 0)
		return matlist;
	matlist->materials = rwMallocT(Material*,numMat, MEMDUR_EVENT | ID_MATERIAL);
	if(matlist->materials == nil)
		goto fail;
	matlist->space = numMat;

	indices = (int32*)rwMalloc(numMat*4, MEMDUR_FUNCTION | ID_MATERIAL);
	stream->read32(indices, numMat*4);

	Material *m;
	for(int32 i = 0; i < numMat; i++){
		if(indices[i] >= 0){
			m = matlist->materials[indices[i]];
			m->addRef();
		}else{
			if(!findChunk(stream, ID_MATERIAL, nil, nil)){
				RWERROR((ERR_CHUNK, "MATERIAL"));
				goto fail;
			}
			m = Material::streamRead(stream);
			if(m == nil)
				goto fail;
		}
		matlist->appendMaterial(m);
		m->destroy();
	}
	rwFree(indices);
	return matlist;
fail:
	rwFree(indices);
	matlist->deinit();
	return nil;
}